

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> *
OpenMD::operator||(OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                   *__return_storage_ptr__,
                  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons1,
                  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons2)

{
  EqualIgnoreCaseConstraint local_90;
  EqualIgnoreCaseConstraint local_50;
  
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint(&local_50,(EqualIgnoreCaseConstraint *)cons1)
  ;
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint(&local_90,(EqualIgnoreCaseConstraint *)cons2)
  ;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
  OrParamConstraint(__return_storage_ptr__,&local_50,&local_90);
  EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_90);
  EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline OrParamConstraint<Cons1T, Cons2T> operator||(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return OrParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }